

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O2

void __thiscall TPZGeoEl::GetHigherSubElements(TPZGeoEl *this,TPZVec<TPZGeoEl_*> *unrefinedSons)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl *son;
  long *local_30;
  
  iVar1 = (**(code **)(*(long *)this + 0x148))();
  iVar3 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    local_30 = (long *)(**(code **)(*(long *)this + 0x1f8))(this,iVar3);
    if (local_30 != (long *)0x0) {
      iVar2 = (**(code **)(*local_30 + 0x1d0))(local_30);
      if (iVar2 == 0) {
        (*unrefinedSons->_vptr_TPZVec[2])
                  (unrefinedSons,(long)((int)unrefinedSons->fNElements + 1),&local_30);
      }
      else {
        (**(code **)(*local_30 + 0xb0))(local_30,unrefinedSons);
      }
    }
  }
  return;
}

Assistant:

void TPZGeoEl::GetHigherSubElements(TPZVec<TPZGeoEl*> &unrefinedSons)
{
    int nsons = this->NSubElements();
    for(int s = 0; s < nsons; s++)
    {
        TPZGeoEl * son = this->SubElement(s);
        if(!son) continue;
    
        if(son->HasSubElement() == false)
        {
            int oldSize = unrefinedSons.NElements();
            unrefinedSons.Resize(oldSize+1, son);
        }
        else
        {
            son->GetHigherSubElements(unrefinedSons);
        }
    }
}